

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O3

int run_test_getsockname_udp(void)

{
  int iVar1;
  uv_loop_t *tcp;
  void *pvVar2;
  char *in_RCX;
  uint port;
  undefined8 *extraout_RDX;
  uv_loop_t *unaff_RBX;
  uv_udp_t *puVar3;
  anon_union_16_2_bf76bca6_for_active_reqs *paVar4;
  code *pcVar5;
  char *pcVar6;
  uv_udp_t *puVar7;
  uv_udp_send_t *loop;
  uv_loop_t *puVar8;
  uv_loop_t *unaff_R14;
  sockaddr sockname;
  sockaddr_in addr;
  undefined8 uStack_b8;
  uchar auStack_b0 [8];
  sockaddr_in sStack_a8;
  char acStack_98 [24];
  uv_loop_t *puStack_80;
  int iStack_6c;
  undefined1 auStack_68 [32];
  undefined1 auStack_48 [16];
  anon_union_16_2_bf76bca6_for_active_reqs local_38;
  int local_24;
  sockaddr_in local_20;
  
  paVar4 = &local_38;
  auStack_48._8_8_ = (void *)0x159682;
  ::loop = uv_default_loop();
  pcVar6 = "0.0.0.0";
  puVar3 = (uv_udp_t *)0x23a3;
  auStack_48._8_8_ = (void *)0x15969f;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&local_20);
  if (iVar1 == 0) {
    auStack_48._8_8_ = (void *)0x1596ba;
    iVar1 = uv_udp_init(::loop,&udpServer);
    if (iVar1 != 0) {
      auStack_48._8_8_ = (void *)0x159844;
      run_test_getsockname_udp_cold_2();
      return 1;
    }
    auStack_48._8_8_ = (void *)0x1596d5;
    iVar1 = uv_udp_bind(&udpServer,(sockaddr *)&local_20,0);
    if (iVar1 != 0) {
      auStack_48._8_8_ = (void *)0x15984b;
      run_test_getsockname_udp_cold_3();
      return 1;
    }
    local_38._8_4_ = 0xffffffff;
    local_38.unused[0] = (void *)0xffffffffffffffff;
    local_38._12_4_ = 0xffffffff;
    local_24 = 0x10;
    puVar7 = &udpServer;
    auStack_48._8_8_ = (void *)0x1596ff;
    iVar1 = uv_udp_getsockname(&udpServer,(sockaddr *)&local_38,&local_24);
    puVar3 = (uv_udp_t *)paVar4;
    loop = (uv_udp_send_t *)puVar7;
    if (iVar1 != 0) goto LAB_00159857;
    in_RCX = "udp listener socket";
    auStack_48._8_8_ = (void *)0x159722;
    check_sockname((sockaddr *)&local_38,"0.0.0.0",0x23a3,"udp listener socket");
    getsocknamecount = getsocknamecount + 1;
    puVar7 = &udpServer;
    pcVar5 = alloc;
    auStack_48._8_8_ = (void *)0x159742;
    iVar1 = uv_udp_recv_start(&udpServer,alloc,udp_recv);
    puVar3 = (uv_udp_t *)pcVar5;
    loop = (uv_udp_send_t *)puVar7;
    if (iVar1 != 0) goto LAB_0015985c;
    puVar3 = &udp;
    auStack_48._8_8_ = (void *)0x15975d;
    loop = (uv_udp_send_t *)::loop;
    iVar1 = uv_udp_init(::loop,&udp);
    if (iVar1 != 0) goto LAB_00159861;
    auStack_48._8_8_ = (void *)0x159776;
    local_38 = (anon_union_16_2_bf76bca6_for_active_reqs)uv_buf_init("PING",4);
    loop = (uv_udp_send_t *)0x1a4b3a;
    puVar3 = (uv_udp_t *)0x23a3;
    auStack_48._8_8_ = (void *)0x159795;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_20);
    if (iVar1 != 0) goto LAB_00159866;
    loop = &send_req;
    puVar3 = &udp;
    in_RCX = (char *)0x1;
    auStack_48._8_8_ = (void *)0x1597c4;
    iVar1 = uv_udp_send(&send_req,&udp,(uv_buf_t *)&local_38,1,(sockaddr *)&local_20,udp_send);
    if (iVar1 != 0) goto LAB_0015986b;
    puVar3 = (uv_udp_t *)0x0;
    auStack_48._8_8_ = (void *)0x1597da;
    loop = (uv_udp_send_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (getsocknamecount != 2) goto LAB_00159870;
    if (udp.send_queue_size != 0) goto LAB_00159875;
    if (udpServer.send_queue_size != 0) goto LAB_0015987a;
    auStack_48._8_8_ = (void *)0x159804;
    unaff_R14 = uv_default_loop();
    unaff_RBX = (uv_loop_t *)0x0;
    auStack_48._8_8_ = (void *)0x15981a;
    uv_walk(unaff_R14,close_walk_cb,(void *)0x0);
    puVar3 = (uv_udp_t *)0x0;
    auStack_48._8_8_ = (void *)0x159824;
    uv_run(unaff_R14,UV_RUN_DEFAULT);
    auStack_48._8_8_ = (void *)0x159829;
    loop = (uv_udp_send_t *)uv_default_loop();
    auStack_48._8_8_ = (void *)0x159831;
    iVar1 = uv_loop_close((uv_loop_t *)loop);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    auStack_48._8_8_ = (void *)0x159857;
    run_test_getsockname_udp_cold_1();
    loop = (uv_udp_send_t *)pcVar6;
LAB_00159857:
    auStack_48._8_8_ = (void *)0x15985c;
    run_test_getsockname_udp_cold_4();
LAB_0015985c:
    auStack_48._8_8_ = (void *)0x159861;
    run_test_getsockname_udp_cold_5();
LAB_00159861:
    auStack_48._8_8_ = (void *)0x159866;
    run_test_getsockname_udp_cold_6();
LAB_00159866:
    auStack_48._8_8_ = (void *)0x15986b;
    run_test_getsockname_udp_cold_7();
LAB_0015986b:
    auStack_48._8_8_ = (void *)0x159870;
    run_test_getsockname_udp_cold_8();
LAB_00159870:
    auStack_48._8_8_ = (void *)0x159875;
    run_test_getsockname_udp_cold_9();
LAB_00159875:
    auStack_48._8_8_ = (void *)0x15987a;
    run_test_getsockname_udp_cold_10();
LAB_0015987a:
    auStack_48._8_8_ = (void *)0x15987f;
    run_test_getsockname_udp_cold_11();
  }
  auStack_48._8_8_ = on_connection;
  run_test_getsockname_udp_cold_12();
  auStack_48._0_8_ = unaff_RBX;
  auStack_48._8_8_ = unaff_R14;
  if ((int)puVar3 == 0) {
    puVar8 = (uv_loop_t *)0xf8;
    tcp = (uv_loop_t *)malloc(0xf8);
    pcVar5 = (code *)puVar3;
    if (tcp == (uv_loop_t *)0x0) goto LAB_00159985;
    pcVar5 = (code *)tcp;
    puVar8 = ::loop;
    iVar1 = uv_tcp_init(::loop,(uv_tcp_t *)tcp);
    unaff_RBX = tcp;
    if (iVar1 != 0) goto LAB_0015998a;
    tcp->data = loop;
    pcVar5 = (code *)tcp;
    iVar1 = uv_accept((uv_stream_t *)loop,(uv_stream_t *)tcp);
    if (iVar1 != 0) goto LAB_0015998f;
    iStack_6c = 0x10;
    pcVar5 = (code *)(auStack_68 + 0x10);
    loop = (uv_udp_send_t *)tcp;
    iVar1 = uv_tcp_getsockname((uv_tcp_t *)tcp,(sockaddr *)pcVar5,&iStack_6c);
    if (iVar1 != 0) goto LAB_00159994;
    in_RCX = "accepted socket";
    check_sockname((sockaddr *)(auStack_68 + 0x10),"127.0.0.1",0x23a3,"accepted socket");
    getsocknamecount = getsocknamecount + 1;
    iStack_6c = 0x10;
    pcVar5 = (code *)auStack_68;
    loop = (uv_udp_send_t *)tcp;
    iVar1 = uv_tcp_getpeername((uv_tcp_t *)tcp,(sockaddr *)pcVar5,&iStack_6c);
    if (iVar1 != 0) goto LAB_00159999;
    in_RCX = "accepted socket peer";
    check_sockname((sockaddr *)auStack_68,"127.0.0.1",connect_port,"accepted socket peer");
    getpeernamecount = getpeernamecount + 1;
    pcVar5 = alloc;
    loop = (uv_udp_send_t *)tcp;
    iVar1 = uv_read_start((uv_stream_t *)tcp,alloc,after_read);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puVar8 = (uv_loop_t *)((ulong)puVar3 & 0xffffffff);
    on_connection_cold_1();
    pcVar5 = (code *)puVar3;
LAB_00159985:
    on_connection_cold_7();
LAB_0015998a:
    loop = (uv_udp_send_t *)puVar8;
    on_connection_cold_2();
LAB_0015998f:
    on_connection_cold_3();
LAB_00159994:
    on_connection_cold_4();
LAB_00159999:
    on_connection_cold_5();
  }
  on_connection_cold_6();
  uStack_b8 = ((uv_loop_t *)loop)->data;
  auStack_b0 = *(uchar (*) [8])&((uv_loop_t *)loop)->active_handles;
  pcVar6 = (char *)(ulong)port;
  puStack_80 = unaff_RBX;
  iVar1 = uv_ip4_addr((char *)pcVar5,port,&sStack_a8);
  if (iVar1 == 0) {
    if ((sa_family_t)uStack_b8 != 2) goto LAB_00159a35;
    if (sStack_a8.sin_family != 2) goto LAB_00159a3a;
    if (uStack_b8._4_4_ != sStack_a8.sin_addr.s_addr) goto LAB_00159a3f;
    if ((port != 0) && (uStack_b8._2_2_ != sStack_a8.sin_port)) goto LAB_00159a49;
    pcVar6 = acStack_98;
    iVar1 = uv_ip4_name((sockaddr_in *)&uStack_b8,pcVar6,0x11);
    if (iVar1 == 0) {
      iVar1 = printf("%s: %s:%d\n",in_RCX,acStack_98,
                     (ulong)(ushort)(uStack_b8._2_2_ << 8 | uStack_b8._2_2_ >> 8));
      return iVar1;
    }
  }
  else {
    check_sockname_cold_1();
LAB_00159a35:
    check_sockname_cold_2();
LAB_00159a3a:
    check_sockname_cold_3();
LAB_00159a3f:
    check_sockname_cold_4();
  }
  check_sockname_cold_6();
LAB_00159a49:
  check_sockname_cold_5();
  pvVar2 = malloc((size_t)pcVar6);
  *extraout_RDX = pvVar2;
  extraout_RDX[1] = pcVar6;
  return (int)pvVar2;
}

Assistant:

TEST_IMPL(getsockname_udp) {
  loop = uv_default_loop();

  if (udp_listener())
    return 1;

  udp_sender();

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(getsocknamecount == 2);

  ASSERT(udp.send_queue_size == 0);
  ASSERT(udpServer.send_queue_size == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}